

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O3

int Fraig_NodeVecPushUnique(Fraig_NodeVec_t *p,Fraig_Node_t *Entry)

{
  long lVar1;
  
  if (0 < (long)p->nSize) {
    lVar1 = 0;
    do {
      if (p->pArray[lVar1] == Entry) {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (p->nSize != lVar1);
  }
  Fraig_NodeVecPush(p,Entry);
  return 0;
}

Assistant:

int Fraig_NodeVecPushUnique( Fraig_NodeVec_t * p, Fraig_Node_t * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Fraig_NodeVecPush( p, Entry );
    return 0;
}